

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS ref_recon_mask_tri(REF_GRID ref_grid,REF_BOOL *replace,REF_INT ldim)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_ADJ pRVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  pRVar1 = ref_grid->node;
  pRVar2 = ref_grid->cell[3];
  lVar4 = 0;
  uVar5 = 0;
  if (0 < ldim) {
    uVar5 = (ulong)(uint)ldim;
  }
  for (; lVar4 < pRVar1->max; lVar4 = lVar4 + 1) {
    if (-1 < pRVar1->global[lVar4]) {
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        pRVar3 = pRVar2->ref_adj;
        uVar7 = 0;
        if (lVar4 < pRVar3->nnode) {
          uVar7 = (uint)(pRVar3->first[lVar4] != -1);
        }
        replace[uVar6] = uVar7;
      }
    }
    replace = replace + ldim;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_recon_mask_tri(REF_GRID ref_grid, REF_BOOL *replace,
                                      REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT i, node;

  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < ldim; i++) {
      replace[i + ldim * node] = !ref_cell_node_empty(ref_cell, node);
    }
  }
  return REF_SUCCESS;
}